

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BCD.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     aaas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (RegisterPair16 *ax,Context *context)

{
  if ((((ax->halves).low & 0xe) < 10) && ((context->flags).auxiliary_carry_ == 0)) {
    (context->flags).carry_ = 0;
  }
  else {
    (ax->halves).low = (ax->halves).low + 6;
    (ax->halves).high = (ax->halves).high + '\x01';
    Flags::set_from<unsigned_int,(InstructionSet::x86::Flag)0,(InstructionSet::x86::Flag)1>
              (&context->flags,1);
  }
  (ax->halves).low = (ax->halves).low & 0xf;
  return;
}

Assistant:

void aaas(
	CPU::RegisterPair16 &ax,
	ContextT &context
) {
	if((ax.halves.low & 0x0f) > 9 || context.flags.template flag<Flag::AuxiliaryCarry>()) {
		if constexpr (add) {
			ax.halves.low += 6;
			++ax.halves.high;
		} else {
			ax.halves.low -= 6;
			--ax.halves.high;
		}
		context.flags.template set_from<Flag::Carry, Flag::AuxiliaryCarry>(1);
	} else {
		context.flags.template set_from<Flag::Carry>(0);
	}
	ax.halves.low &= 0x0f;
}